

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::Base64Handler::encode
          (Base64Handler *this,JsonCodec *codec,Reader input,Builder output)

{
  bool in_R8B;
  ArrayPtr<const_unsigned_char> input_00;
  Reader value;
  Array<char> local_20;
  
  input_00.size_ = 0;
  input_00.ptr = (uchar *)input.super_ArrayPtr<const_unsigned_char>.size_;
  kj::encodeBase64((String *)&local_20,(kj *)input.super_ArrayPtr<const_unsigned_char>.ptr,input_00,
                   in_R8B);
  if (local_20.size_ == 0) {
    local_20.ptr = "";
  }
  value.super_StringPtr.content.size_ = local_20.size_ + (local_20.size_ == 0);
  value.super_StringPtr.content.ptr = local_20.ptr;
  json::Value::Builder::setString(&output,value);
  kj::Array<char>::~Array(&local_20);
  return;
}

Assistant:

void encode(const JsonCodec& codec, capnp::Data::Reader input, JsonValue::Builder output) const {
    output.setString(kj::encodeBase64(input));
  }